

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<kj::Vector<kj::String>const&>
          (String *__return_storage_ptr__,kj *this,Vector<kj::String> *params)

{
  long local_48;
  long local_40;
  char *local_38;
  undefined8 local_30;
  Array<kj::ArrayPtr<const_char>_> local_28;
  
  local_48 = *(long *)this;
  local_40 = (*(long *)(this + 8) - local_48) / 0x18;
  local_38 = ", ";
  local_30 = 3;
  local_28.ptr = (ArrayPtr<const_char> *)0x0;
  local_28.size_ = 0;
  local_28.disposer = (ArrayDisposer *)0x0;
  _::concat<kj::_::Delimited<kj::ArrayPtr<kj::String_const>>>
            (__return_storage_ptr__,(_ *)&local_48,
             (Delimited<kj::ArrayPtr<const_kj::String>_> *)((*(long *)(this + 8) - local_48) % 0x18)
            );
  Array<kj::ArrayPtr<const_char>_>::~Array(&local_28);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}